

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::
FormatString<char[22],std::__cxx11::string,char[16],char[13],char[9],Diligent::MemorySizeFormatter<unsigned_long>,char[13],unsigned_int,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [22],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_1,
          char (*Args_2) [16],char (*Args_3) [13],char (*Args_4) [9],
          MemorySizeFormatter<unsigned_long> *Args_5,char (*Args_6) [13],uint *Args_7,
          char (*Args_8) [28],MemorySizeFormatter<unsigned_long> *Args_9)

{
  stringstream local_1d8 [8];
  stringstream ss;
  char (*Args_local_4) [9];
  char (*Args_local_3) [13];
  char (*Args_local_2) [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_local_1;
  char (*Args_local) [22];
  
  std::__cxx11::stringstream::stringstream(local_1d8);
  FormatStrSS<std::__cxx11::stringstream,char[22],std::__cxx11::string,char[16],char[13],char[9],Diligent::MemorySizeFormatter<unsigned_long>,char[13],unsigned_int,char[28],Diligent::MemorySizeFormatter<unsigned_long>>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8,
             (char (*) [22])this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Args,
             (char (*) [16])Args_1,(char (*) [13])Args_2,(char (*) [9])Args_3,
             (MemorySizeFormatter<unsigned_long> *)Args_4,(char (*) [13])Args_5,(uint *)Args_6,
             (char (*) [28])Args_7,(MemorySizeFormatter<unsigned_long> *)Args_8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}